

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

HashElem * findElementWithHash(Hash *pH,char *pKey,uint *pHash)

{
  uint uVar1;
  int iVar2;
  _ht *pEntry;
  uint h;
  uint count;
  HashElem *elem;
  uint *pHash_local;
  char *pKey_local;
  Hash *pH_local;
  
  if (pH->ht == (_ht *)0x0) {
    pEntry._0_4_ = 0;
    _h = pH->first;
    pEntry._4_4_ = pH->count;
  }
  else {
    uVar1 = strHash(pKey);
    pEntry._0_4_ = uVar1 % pH->htsize;
    _h = pH->ht[(uint)pEntry].chain;
    pEntry._4_4_ = pH->ht[(uint)pEntry].count;
  }
  if (pHash != (uint *)0x0) {
    *pHash = (uint)pEntry;
  }
  while( true ) {
    if (pEntry._4_4_ == 0) {
      pH_local = (Hash *)&findElementWithHash::nullElement;
      return (HashElem *)pH_local;
    }
    iVar2 = sqlite3StrICmp(_h->pKey,pKey);
    if (iVar2 == 0) break;
    _h = _h->next;
    pEntry._4_4_ = pEntry._4_4_ - 1;
  }
  return _h;
}

Assistant:

static HashElem *findElementWithHash(
  const Hash *pH,     /* The pH to be searched */
  const char *pKey,   /* The key we are searching for */
  unsigned int *pHash /* Write the hash value here */
){
  HashElem *elem;                /* Used to loop thru the element list */
  unsigned int count;            /* Number of elements left to test */
  unsigned int h;                /* The computed hash */
  static HashElem nullElement = { 0, 0, 0, 0 };

  if( pH->ht ){   /*OPTIMIZATION-IF-TRUE*/
    struct _ht *pEntry;
    h = strHash(pKey) % pH->htsize;
    pEntry = &pH->ht[h];
    elem = pEntry->chain;
    count = pEntry->count;
  }else{
    h = 0;
    elem = pH->first;
    count = pH->count;
  }
  if( pHash ) *pHash = h;
  while( count-- ){
    assert( elem!=0 );
    if( sqlite3StrICmp(elem->pKey,pKey)==0 ){ 
      return elem;
    }
    elem = elem->next;
  }
  return &nullElement;
}